

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O2

string * __thiscall
cmRulePlaceholderExpander::ExpandVariable
          (string *__return_storage_ptr__,cmRulePlaceholderExpander *this,string *variable)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmOutputConverter *pcVar1;
  bool bVar2;
  long lVar3;
  string *psVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  RuleVariables *pRVar9;
  char *pcVar10;
  _Base_ptr __rhs;
  string_view source;
  string_view str;
  string_view str_00;
  string targetBase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  mapped_type *local_48;
  mapped_type *local_40;
  mapped_type *local_38;
  
  pRVar9 = this->ReplaceValues;
  if (pRVar9->LinkFlags != (char *)0x0) {
    bVar2 = std::operator==(variable,"LINK_FLAGS");
    pRVar9 = this->ReplaceValues;
    if (bVar2) {
      pcVar10 = pRVar9->LinkFlags;
      goto LAB_00235ac3;
    }
  }
  if (pRVar9->Linker == (char *)0x0) {
LAB_0023532b:
    if (pRVar9->Manifests != (char *)0x0) {
      bVar2 = std::operator==(variable,"MANIFESTS");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->Manifests;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->Flags != (char *)0x0) {
      bVar2 = std::operator==(variable,"FLAGS");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->Flags;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->Source != (char *)0x0) {
      bVar2 = std::operator==(variable,"SOURCE");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->Source;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->DynDepFile != (char *)0x0) {
      bVar2 = std::operator==(variable,"DYNDEP_FILE");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->DynDepFile;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->PreprocessedSource != (char *)0x0) {
      bVar2 = std::operator==(variable,"PREPROCESSED_SOURCE");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->PreprocessedSource;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->AssemblySource != (char *)0x0) {
      bVar2 = std::operator==(variable,"ASSEMBLY_SOURCE");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->AssemblySource;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->Object != (char *)0x0) {
      bVar2 = std::operator==(variable,"OBJECT");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->Object;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->ObjectDir != (char *)0x0) {
      bVar2 = std::operator==(variable,"OBJECT_DIR");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->ObjectDir;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->ObjectFileDir != (char *)0x0) {
      bVar2 = std::operator==(variable,"OBJECT_FILE_DIR");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->ObjectFileDir;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->Objects != (char *)0x0) {
      bVar2 = std::operator==(variable,"OBJECTS");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->Objects;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->ObjectsQuoted != (char *)0x0) {
      bVar2 = std::operator==(variable,"OBJECTS_QUOTED");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->ObjectsQuoted;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->CudaCompileMode != (char *)0x0) {
      bVar2 = std::operator==(variable,"CUDA_COMPILE_MODE");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->CudaCompileMode;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->AIXExports != (char *)0x0) {
      bVar2 = std::operator==(variable,"AIX_EXPORTS");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->AIXExports;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->ISPCHeader != (char *)0x0) {
      bVar2 = std::operator==(variable,"ISPC_HEADER");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->ISPCHeader;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->Defines != (char *)0x0) {
      bVar2 = std::operator==(variable,"DEFINES");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->Defines;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->Includes != (char *)0x0) {
      bVar2 = std::operator==(variable,"INCLUDES");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->Includes;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->SwiftLibraryName != (char *)0x0) {
      bVar2 = std::operator==(variable,"SWIFT_LIBRARY_NAME");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->SwiftLibraryName;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->SwiftModule != (char *)0x0) {
      bVar2 = std::operator==(variable,"SWIFT_MODULE");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->SwiftModule;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->SwiftModuleName != (char *)0x0) {
      bVar2 = std::operator==(variable,"SWIFT_MODULE_NAME");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->SwiftModuleName;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->SwiftSources != (char *)0x0) {
      bVar2 = std::operator==(variable,"SWIFT_SOURCES");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->SwiftSources;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->TargetPDB != (char *)0x0) {
      bVar2 = std::operator==(variable,"TARGET_PDB");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->TargetPDB;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->TargetCompilePDB != (char *)0x0) {
      bVar2 = std::operator==(variable,"TARGET_COMPILE_PDB");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->TargetCompilePDB;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->DependencyFile != (char *)0x0) {
      bVar2 = std::operator==(variable,"DEP_FILE");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->DependencyFile;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->DependencyTarget != (char *)0x0) {
      bVar2 = std::operator==(variable,"DEP_TARGET");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->DependencyTarget;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->Fatbinary != (char *)0x0) {
      bVar2 = std::operator==(variable,"FATBINARY");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->Fatbinary;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->RegisterFile != (char *)0x0) {
      bVar2 = std::operator==(variable,"REGISTER_FILE");
      pRVar9 = this->ReplaceValues;
      if (bVar2) {
        pcVar10 = pRVar9->RegisterFile;
        goto LAB_00235ac3;
      }
    }
    if (pRVar9->Target == (char *)0x0) {
LAB_002359f8:
      bVar2 = std::operator==(variable,"TARGET_SONAME");
      if (((bVar2) || (bVar2 = std::operator==(variable,"SONAME_FLAG"), bVar2)) ||
         (bVar2 = std::operator==(variable,"TARGET_INSTALLNAME_DIR"), bVar2)) {
        if (this->ReplaceValues->TargetSOName != (char *)0x0) {
          bVar2 = std::operator==(variable,"TARGET_SONAME");
          if (bVar2) {
            pcVar10 = this->ReplaceValues->TargetSOName;
            goto LAB_00235ac3;
          }
          bVar2 = std::operator==(variable,"SONAME_FLAG");
          if ((bVar2) && (pcVar10 = this->ReplaceValues->SONameFlag, pcVar10 != (char *)0x0))
          goto LAB_00235ac3;
          if ((this->ReplaceValues->TargetInstallNameDir != (char *)0x0) &&
             (bVar2 = std::operator==(variable,"TARGET_INSTALLNAME_DIR"), bVar2)) {
            pcVar10 = this->ReplaceValues->TargetInstallNameDir;
            goto LAB_00235ac3;
          }
        }
        pcVar10 = "";
LAB_00235ac3:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar10,(allocator<char> *)&targetBase);
        return __return_storage_ptr__;
      }
      pRVar9 = this->ReplaceValues;
      if (pRVar9->LinkLibraries != (char *)0x0) {
        bVar2 = std::operator==(variable,"LINK_LIBRARIES");
        pRVar9 = this->ReplaceValues;
        if (bVar2) {
          pcVar10 = pRVar9->LinkLibraries;
          goto LAB_00235ac3;
        }
      }
      if (pRVar9->Language != (char *)0x0) {
        bVar2 = std::operator==(variable,"LANGUAGE");
        pRVar9 = this->ReplaceValues;
        if (bVar2) {
          pcVar10 = pRVar9->Language;
          goto LAB_00235ac3;
        }
      }
      if (pRVar9->CMTargetName != (char *)0x0) {
        bVar2 = std::operator==(variable,"TARGET_NAME");
        pRVar9 = this->ReplaceValues;
        if (bVar2) {
          pcVar10 = pRVar9->CMTargetName;
          goto LAB_00235ac3;
        }
      }
      if (pRVar9->CMTargetType != (char *)0x0) {
        bVar2 = std::operator==(variable,"TARGET_TYPE");
        pRVar9 = this->ReplaceValues;
        if (bVar2) {
          pcVar10 = pRVar9->CMTargetType;
          goto LAB_00235ac3;
        }
      }
      if ((pRVar9->Output != (char *)0x0) && (bVar2 = std::operator==(variable,"OUTPUT"), bVar2)) {
        pcVar10 = this->ReplaceValues->Output;
        goto LAB_00235ac3;
      }
      bVar2 = std::operator==(variable,"CMAKE_COMMAND");
      if (bVar2) {
        pcVar1 = this->OutputConverter;
        psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        source._M_str = (psVar4->_M_dataplus)._M_p;
        source._M_len = psVar4->_M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (__return_storage_ptr__,pcVar1,source,SHELL,false);
        return __return_storage_ptr__;
      }
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->Compilers)._M_t,variable);
      if ((_Rb_tree_header *)iVar5._M_node == &(this->Compilers)._M_t._M_impl.super__Rb_tree_header)
      {
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&(this->VariableMappings)._M_t,variable);
        if ((_Rb_tree_header *)iVar5._M_node !=
            &(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header) {
          lVar3 = std::__cxx11::string::find((char *)variable,0x6f32dc);
          if (lVar3 == -1) {
            cmOutputConverter::ConvertToOutputForExisting
                      (__return_storage_ptr__,this->OutputConverter,(string *)(iVar5._M_node + 2),
                       SHELL,false);
            return __return_storage_ptr__;
          }
          variable = (string *)(iVar5._M_node + 2);
        }
LAB_00235936:
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)variable);
        return __return_storage_ptr__;
      }
      pcVar1 = this->OutputConverter;
      __rhs = iVar5._M_node + 2;
      std::operator+(&local_68,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&targetBase,&local_68,"_COMPILER");
      this_00 = &this->VariableMappings;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&targetBase);
      cmOutputConverter::ConvertToOutputForExisting
                (__return_storage_ptr__,pcVar1,pmVar6,SHELL,false);
      std::__cxx11::string::~string((string *)&targetBase);
      std::__cxx11::string::~string((string *)&local_68);
      std::operator+(&local_68,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&targetBase,&local_68,"_COMPILER_ARG1");
      local_38 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&targetBase);
      std::__cxx11::string::~string((string *)&targetBase);
      std::__cxx11::string::~string((string *)&local_68);
      std::operator+(&local_68,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&targetBase,&local_68,"_COMPILER_TARGET");
      local_40 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&targetBase);
      std::__cxx11::string::~string((string *)&targetBase);
      std::__cxx11::string::~string((string *)&local_68);
      std::operator+(&local_68,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&targetBase,&local_68,"_COMPILE_OPTIONS_TARGET");
      local_48 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&targetBase);
      std::__cxx11::string::~string((string *)&targetBase);
      std::__cxx11::string::~string((string *)&local_68);
      std::operator+(&local_68,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&targetBase,&local_68,"_COMPILER_EXTERNAL_TOOLCHAIN");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&targetBase);
      std::__cxx11::string::~string((string *)&targetBase);
      std::__cxx11::string::~string((string *)&local_68);
      std::operator+(&local_68,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&targetBase,&local_68,"_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&targetBase);
      std::__cxx11::string::~string((string *)&targetBase);
      std::__cxx11::string::~string((string *)&local_68);
      std::operator+(&local_68,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&targetBase,&local_68,"_COMPILE_OPTIONS_SYSROOT");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&targetBase);
      std::__cxx11::string::~string((string *)&targetBase);
      std::__cxx11::string::~string((string *)&local_68);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs,this->ReplaceValues->Language);
      if ((bVar2) && (this->ReplaceValues->Launcher != (char *)0x0)) {
        cmStrCat<char_const*const&,char_const(&)[2],std::__cxx11::string&>
                  (&targetBase,&this->ReplaceValues->Launcher,(char (*) [2])0x6f1305,
                   __return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&targetBase);
        std::__cxx11::string::~string((string *)&targetBase);
      }
      if (local_38->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      if ((local_40->_M_string_length != 0) && (local_48->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      if ((pmVar6->_M_string_length != 0) && (pmVar7->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        str._M_str = (pmVar6->_M_dataplus)._M_p;
        str._M_len = pmVar6->_M_string_length;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&targetBase,this->OutputConverter,str,true,false,false,false,false);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&targetBase);
      }
      targetBase._M_dataplus._M_p = (pointer)&targetBase.field_2;
      targetBase._M_string_length = 0;
      targetBase.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&targetBase);
      if ((targetBase._M_string_length != 0) && (pmVar8->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        str_00._M_str = targetBase._M_dataplus._M_p;
        str_00._M_len = targetBase._M_string_length;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&local_68,this->OutputConverter,str_00,true,false,false,false,false);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_68);
      }
      goto LAB_00235321;
    }
    bVar2 = std::operator==(variable,"TARGET_QUOTED");
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,this->ReplaceValues->Target,
                 (allocator<char> *)&targetBase);
      if (__return_storage_ptr__->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      if (*(__return_storage_ptr__->_M_dataplus)._M_p == '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,'\"');
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    bVar2 = std::operator==(variable,"TARGET_UNQUOTED");
    pRVar9 = this->ReplaceValues;
    if (!bVar2) {
      if (pRVar9->LanguageCompileFlags != (char *)0x0) {
        bVar2 = std::operator==(variable,"LANGUAGE_COMPILE_FLAGS");
        pRVar9 = this->ReplaceValues;
        if (bVar2) {
          pcVar10 = pRVar9->LanguageCompileFlags;
          goto LAB_00235ac3;
        }
      }
      if ((pRVar9->Target != (char *)0x0) && (bVar2 = std::operator==(variable,"TARGET"), bVar2)) {
        pcVar10 = this->ReplaceValues->Target;
        goto LAB_00235ac3;
      }
      bVar2 = std::operator==(variable,"TARGET_IMPLIB");
      if (bVar2) {
        variable = &this->TargetImpLib;
        goto LAB_00235936;
      }
      bVar2 = std::operator==(variable,"TARGET_VERSION_MAJOR");
      if (bVar2) {
        pcVar10 = this->ReplaceValues->TargetVersionMajor;
      }
      else {
        bVar2 = std::operator==(variable,"TARGET_VERSION_MINOR");
        if (!bVar2) {
          if ((this->ReplaceValues->Target != (char *)0x0) &&
             (bVar2 = std::operator==(variable,"TARGET_BASE"), bVar2)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&targetBase,this->ReplaceValues->Target,
                       (allocator<char> *)&local_68);
            lVar3 = std::__cxx11::string::rfind((char)&targetBase,0x2e);
            if (lVar3 == -1) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)targetBase._M_dataplus._M_p == &targetBase.field_2) {
                (__return_storage_ptr__->field_2)._M_allocated_capacity =
                     CONCAT71(targetBase.field_2._M_allocated_capacity._1_7_,
                              targetBase.field_2._M_local_buf[0]);
                *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                     targetBase.field_2._8_8_;
              }
              else {
                (__return_storage_ptr__->_M_dataplus)._M_p = targetBase._M_dataplus._M_p;
                (__return_storage_ptr__->field_2)._M_allocated_capacity =
                     CONCAT71(targetBase.field_2._M_allocated_capacity._1_7_,
                              targetBase.field_2._M_local_buf[0]);
              }
              __return_storage_ptr__->_M_string_length = targetBase._M_string_length;
              targetBase._M_string_length = 0;
              targetBase.field_2._M_local_buf[0] = '\0';
              targetBase._M_dataplus._M_p = (pointer)&targetBase.field_2;
            }
            else {
              std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&targetBase);
            }
            goto LAB_00235321;
          }
          goto LAB_002359f8;
        }
        pcVar10 = this->ReplaceValues->TargetVersionMinor;
      }
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "0";
      }
      goto LAB_00235ac3;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pRVar9->Target,(allocator<char> *)&targetBase);
    if (__return_storage_ptr__->_M_string_length < 3) {
      return __return_storage_ptr__;
    }
    pcVar10 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if (*pcVar10 != '\"') {
      return __return_storage_ptr__;
    }
    if (pcVar10[__return_storage_ptr__->_M_string_length - 1] != '\"') {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&targetBase,(ulong)__return_storage_ptr__);
  }
  else {
    bVar2 = std::operator==(variable,"CMAKE_LINKER");
    pRVar9 = this->ReplaceValues;
    if (!bVar2) goto LAB_0023532b;
    pcVar1 = this->OutputConverter;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetBase,pRVar9->Linker,(allocator<char> *)&local_68);
    cmOutputConverter::ConvertToOutputForExisting
              (__return_storage_ptr__,pcVar1,&targetBase,SHELL,false);
    std::__cxx11::string::~string((string *)&targetBase);
    if (this->ReplaceValues->Launcher == (char *)0x0) {
      return __return_storage_ptr__;
    }
    cmStrCat<char_const*const&,char_const(&)[2],std::__cxx11::string&>
              (&targetBase,&this->ReplaceValues->Launcher,(char (*) [2])0x6f1305,
               __return_storage_ptr__);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&targetBase);
LAB_00235321:
  std::__cxx11::string::~string((string *)&targetBase);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRulePlaceholderExpander::ExpandVariable(
  std::string const& variable)
{
  if (this->ReplaceValues->LinkFlags) {
    if (variable == "LINK_FLAGS") {
      return this->ReplaceValues->LinkFlags;
    }
  }
  if (this->ReplaceValues->Linker) {
    if (variable == "CMAKE_LINKER") {
      auto result = this->OutputConverter->ConvertToOutputForExisting(
        this->ReplaceValues->Linker);
      if (this->ReplaceValues->Launcher) {
        // Add launcher as part of expansion so that it always appears
        // immediately before the command itself, regardless of whether the
        // overall rule template contains other content at the front.
        result = cmStrCat(this->ReplaceValues->Launcher, " ", result);
      }
      return result;
    }
  }
  if (this->ReplaceValues->Manifests) {
    if (variable == "MANIFESTS") {
      return this->ReplaceValues->Manifests;
    }
  }
  if (this->ReplaceValues->Flags) {
    if (variable == "FLAGS") {
      return this->ReplaceValues->Flags;
    }
  }

  if (this->ReplaceValues->Source) {
    if (variable == "SOURCE") {
      return this->ReplaceValues->Source;
    }
  }
  if (this->ReplaceValues->DynDepFile) {
    if (variable == "DYNDEP_FILE") {
      return this->ReplaceValues->DynDepFile;
    }
  }
  if (this->ReplaceValues->PreprocessedSource) {
    if (variable == "PREPROCESSED_SOURCE") {
      return this->ReplaceValues->PreprocessedSource;
    }
  }
  if (this->ReplaceValues->AssemblySource) {
    if (variable == "ASSEMBLY_SOURCE") {
      return this->ReplaceValues->AssemblySource;
    }
  }
  if (this->ReplaceValues->Object) {
    if (variable == "OBJECT") {
      return this->ReplaceValues->Object;
    }
  }
  if (this->ReplaceValues->ObjectDir) {
    if (variable == "OBJECT_DIR") {
      return this->ReplaceValues->ObjectDir;
    }
  }
  if (this->ReplaceValues->ObjectFileDir) {
    if (variable == "OBJECT_FILE_DIR") {
      return this->ReplaceValues->ObjectFileDir;
    }
  }
  if (this->ReplaceValues->Objects) {
    if (variable == "OBJECTS") {
      return this->ReplaceValues->Objects;
    }
  }
  if (this->ReplaceValues->ObjectsQuoted) {
    if (variable == "OBJECTS_QUOTED") {
      return this->ReplaceValues->ObjectsQuoted;
    }
  }
  if (this->ReplaceValues->CudaCompileMode) {
    if (variable == "CUDA_COMPILE_MODE") {
      return this->ReplaceValues->CudaCompileMode;
    }
  }
  if (this->ReplaceValues->AIXExports) {
    if (variable == "AIX_EXPORTS") {
      return this->ReplaceValues->AIXExports;
    }
  }
  if (this->ReplaceValues->ISPCHeader) {
    if (variable == "ISPC_HEADER") {
      return this->ReplaceValues->ISPCHeader;
    }
  }
  if (this->ReplaceValues->Defines && variable == "DEFINES") {
    return this->ReplaceValues->Defines;
  }
  if (this->ReplaceValues->Includes && variable == "INCLUDES") {
    return this->ReplaceValues->Includes;
  }
  if (this->ReplaceValues->SwiftLibraryName) {
    if (variable == "SWIFT_LIBRARY_NAME") {
      return this->ReplaceValues->SwiftLibraryName;
    }
  }
  if (this->ReplaceValues->SwiftModule) {
    if (variable == "SWIFT_MODULE") {
      return this->ReplaceValues->SwiftModule;
    }
  }
  if (this->ReplaceValues->SwiftModuleName) {
    if (variable == "SWIFT_MODULE_NAME") {
      return this->ReplaceValues->SwiftModuleName;
    }
  }
  if (this->ReplaceValues->SwiftSources) {
    if (variable == "SWIFT_SOURCES") {
      return this->ReplaceValues->SwiftSources;
    }
  }
  if (this->ReplaceValues->TargetPDB) {
    if (variable == "TARGET_PDB") {
      return this->ReplaceValues->TargetPDB;
    }
  }
  if (this->ReplaceValues->TargetCompilePDB) {
    if (variable == "TARGET_COMPILE_PDB") {
      return this->ReplaceValues->TargetCompilePDB;
    }
  }
  if (this->ReplaceValues->DependencyFile) {
    if (variable == "DEP_FILE") {
      return this->ReplaceValues->DependencyFile;
    }
  }
  if (this->ReplaceValues->DependencyTarget) {
    if (variable == "DEP_TARGET") {
      return this->ReplaceValues->DependencyTarget;
    }
  }
  if (this->ReplaceValues->Fatbinary) {
    if (variable == "FATBINARY") {
      return this->ReplaceValues->Fatbinary;
    }
  }
  if (this->ReplaceValues->RegisterFile) {
    if (variable == "REGISTER_FILE") {
      return this->ReplaceValues->RegisterFile;
    }
  }

  if (this->ReplaceValues->Target) {
    if (variable == "TARGET_QUOTED") {
      std::string targetQuoted = this->ReplaceValues->Target;
      if (!targetQuoted.empty() && targetQuoted.front() != '\"') {
        targetQuoted = '\"';
        targetQuoted += this->ReplaceValues->Target;
        targetQuoted += '\"';
      }
      return targetQuoted;
    }
    if (variable == "TARGET_UNQUOTED") {
      std::string unquoted = this->ReplaceValues->Target;
      std::string::size_type sz = unquoted.size();
      if (sz > 2 && unquoted.front() == '\"' && unquoted.back() == '\"') {
        unquoted = unquoted.substr(1, sz - 2);
      }
      return unquoted;
    }
    if (this->ReplaceValues->LanguageCompileFlags) {
      if (variable == "LANGUAGE_COMPILE_FLAGS") {
        return this->ReplaceValues->LanguageCompileFlags;
      }
    }
    if (this->ReplaceValues->Target) {
      if (variable == "TARGET") {
        return this->ReplaceValues->Target;
      }
    }
    if (variable == "TARGET_IMPLIB") {
      return this->TargetImpLib;
    }
    if (variable == "TARGET_VERSION_MAJOR") {
      if (this->ReplaceValues->TargetVersionMajor) {
        return this->ReplaceValues->TargetVersionMajor;
      }
      return "0";
    }
    if (variable == "TARGET_VERSION_MINOR") {
      if (this->ReplaceValues->TargetVersionMinor) {
        return this->ReplaceValues->TargetVersionMinor;
      }
      return "0";
    }
    if (this->ReplaceValues->Target) {
      if (variable == "TARGET_BASE") {
        // Strip the last extension off the target name.
        std::string targetBase = this->ReplaceValues->Target;
        std::string::size_type pos = targetBase.rfind('.');
        if (pos != std::string::npos) {
          return targetBase.substr(0, pos);
        }
        return targetBase;
      }
    }
  }
  if (variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
      variable == "TARGET_INSTALLNAME_DIR") {
    // All these variables depend on TargetSOName
    if (this->ReplaceValues->TargetSOName) {
      if (variable == "TARGET_SONAME") {
        return this->ReplaceValues->TargetSOName;
      }
      if (variable == "SONAME_FLAG" && this->ReplaceValues->SONameFlag) {
        return this->ReplaceValues->SONameFlag;
      }
      if (this->ReplaceValues->TargetInstallNameDir &&
          variable == "TARGET_INSTALLNAME_DIR") {
        return this->ReplaceValues->TargetInstallNameDir;
      }
    }
    return "";
  }
  if (this->ReplaceValues->LinkLibraries) {
    if (variable == "LINK_LIBRARIES") {
      return this->ReplaceValues->LinkLibraries;
    }
  }
  if (this->ReplaceValues->Language) {
    if (variable == "LANGUAGE") {
      return this->ReplaceValues->Language;
    }
  }
  if (this->ReplaceValues->CMTargetName) {
    if (variable == "TARGET_NAME") {
      return this->ReplaceValues->CMTargetName;
    }
  }
  if (this->ReplaceValues->CMTargetType) {
    if (variable == "TARGET_TYPE") {
      return this->ReplaceValues->CMTargetType;
    }
  }
  if (this->ReplaceValues->Output) {
    if (variable == "OUTPUT") {
      return this->ReplaceValues->Output;
    }
  }
  if (variable == "CMAKE_COMMAND") {
    return this->OutputConverter->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
  }

  auto compIt = this->Compilers.find(variable);

  if (compIt != this->Compilers.end()) {
    std::string ret = this->OutputConverter->ConvertToOutputForExisting(
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER"]);
    std::string const& compilerArg1 =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_ARG1"];
    std::string const& compilerTarget =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_TARGET"];
    std::string const& compilerOptionTarget =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_TARGET"];
    std::string const& compilerExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILER_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionSysroot =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_SYSROOT"];

    if (compIt->second == this->ReplaceValues->Language &&
        this->ReplaceValues->Launcher) {
      // Add launcher as part of expansion so that it always appears
      // immediately before the command itself, regardless of whether the
      // overall rule template contains other content at the front.
      ret = cmStrCat(this->ReplaceValues->Launcher, " ", ret);
    }

    // if there are required arguments to the compiler add it
    // to the compiler string
    if (!compilerArg1.empty()) {
      ret += " ";
      ret += compilerArg1;
    }
    if (!compilerTarget.empty() && !compilerOptionTarget.empty()) {
      ret += " ";
      ret += compilerOptionTarget;
      ret += compilerTarget;
    }
    if (!compilerExternalToolchain.empty() &&
        !compilerOptionExternalToolchain.empty()) {
      ret += " ";
      ret += compilerOptionExternalToolchain;
      ret +=
        this->OutputConverter->EscapeForShell(compilerExternalToolchain, true);
    }
    std::string sysroot;
    // Some platforms may use separate sysroots for compiling and linking.
    // If we detect link flags, then we pass the link sysroot instead.
    // FIXME: Use a more robust way to detect link line expansion.
    if (this->ReplaceValues->LinkFlags) {
      sysroot = this->LinkerSysroot;
    } else {
      sysroot = this->CompilerSysroot;
    }
    if (!sysroot.empty() && !compilerOptionSysroot.empty()) {
      ret += " ";
      ret += compilerOptionSysroot;
      ret += this->OutputConverter->EscapeForShell(sysroot, true);
    }
    return ret;
  }

  auto mapIt = this->VariableMappings.find(variable);
  if (mapIt != this->VariableMappings.end()) {
    if (variable.find("_FLAG") == std::string::npos) {
      return this->OutputConverter->ConvertToOutputForExisting(mapIt->second);
    }
    return mapIt->second;
  }
  return variable;
}